

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionaryTestCase.cpp
# Opt level: O2

void anon_unknown.dwarf_169ea0::fillHeaderTrailer(Message *message)

{
  undefined1 *this;
  allocator<char> local_91;
  STRING local_90;
  FieldBase local_70;
  
  this = &message->field_0x70;
  FIX::BodyLength::BodyLength((BodyLength *)&local_70,0);
  FIX44::Header::set((Header *)this,(BodyLength *)&local_70);
  FIX::FieldBase::~FieldBase(&local_70);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"FIXTEST",&local_91);
  FIX::SenderCompID::SenderCompID((SenderCompID *)&local_70,&local_90);
  FIX44::Header::set((Header *)this,(SenderCompID *)&local_70);
  FIX::FieldBase::~FieldBase(&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"TW",&local_91);
  FIX::TargetCompID::TargetCompID((TargetCompID *)&local_70,&local_90);
  FIX44::Header::set((Header *)this,(TargetCompID *)&local_70);
  FIX::FieldBase::~FieldBase(&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  FIX::MsgSeqNum::MsgSeqNum((MsgSeqNum *)&local_70,1);
  FIX44::Header::set((Header *)this,(MsgSeqNum *)&local_70);
  FIX::FieldBase::~FieldBase(&local_70);
  FIX::UtcTimeStamp::now();
  FIX::SendingTime::SendingTime((SendingTime *)&local_70,(UTCTIMESTAMP *)&local_90);
  FIX44::Header::set((Header *)this,(SendingTime *)&local_70);
  FIX::FieldBase::~FieldBase(&local_70);
  FIX::CheckSum::CheckSum((CheckSum *)&local_70,0);
  FIX44::Trailer::set((Trailer *)&message->field_0xe0,(CheckSum *)&local_70);
  FIX::FieldBase::~FieldBase(&local_70);
  return;
}

Assistant:

static void fillHeaderTrailer(FIX44::Message &message) {
  message.getHeader().set(FIX::BodyLength(0));
  message.getHeader().set(SenderCompID("FIXTEST"));
  message.getHeader().set(TargetCompID("TW"));
  message.getHeader().set(MsgSeqNum(1));
  message.getHeader().set(SendingTime(UtcTimeStamp::now()));
  message.getTrailer().set(CheckSum(0));
}